

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::HeapType::HeapType(HeapType *this,Array *array)

{
  undefined8 uVar1;
  HeapType HVar2;
  Array *info;
  undefined8 local_20;
  
  info = array;
  local_20 = operator_new(0x50);
  uVar1 = *(undefined8 *)&(array->element).packedType;
  *(uintptr_t *)(local_20 + 0x38) = (array->element).type.id;
  *(undefined8 *)(local_20 + 0x40) = uVar1;
  *(undefined2 *)local_20 = 0;
  *(undefined4 *)(local_20 + 4) = 1;
  *(undefined8 *)(local_20 + 0x18) = 0;
  *(undefined8 *)(local_20 + 0x20) = 0;
  *(undefined8 *)(local_20 + 0x28) = 0;
  *(undefined8 *)(local_20 + 8) = 0;
  *(undefined8 *)(local_20 + 0x10) = 0;
  *(undefined4 *)(local_20 + 0x30) = 3;
  HVar2 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)&stack0xffffffffffffffe0,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)info);
  this->id = (uintptr_t)HVar2;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

HeapType::HeapType(Array array) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(array)));
}